

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
address_space_write_rom_internal
          (AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *ptr,hwaddr len,write_rom_type type)

{
  _Bool _Var1;
  int iVar2;
  MemoryRegion_conflict *mr_00;
  uint8_t *local_60;
  uint8_t *buf;
  MemoryRegion_conflict *mr;
  hwaddr addr1;
  uint8_t *ram_ptr;
  hwaddr l;
  uint8_t *puStack_30;
  write_rom_type type_local;
  hwaddr len_local;
  void *ptr_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  MemTxAttrs attrs_local;
  
  local_60 = (uint8_t *)ptr;
  l._4_4_ = type;
  len_local = (hwaddr)ptr;
  ptr_local = (void *)addr;
  addr_local = (hwaddr)as;
  as_local._4_4_ = attrs;
  for (puStack_30 = (uint8_t *)len; puStack_30 != (uint8_t *)0x0;
      puStack_30 = puStack_30 + -(long)ram_ptr) {
    ram_ptr = puStack_30;
    mr_00 = address_space_translate
                      ((AddressSpace *)addr_local,(hwaddr)ptr_local,(hwaddr *)&mr,(hwaddr *)&ram_ptr
                       ,true,as_local._4_4_);
    _Var1 = memory_region_is_ram(mr_00);
    if (_Var1) {
      addr1 = (hwaddr)qemu_map_ram_ptr_tricore
                                (*(uc_struct_conflict15 **)(addr_local + 0x30),mr_00->ram_block,
                                 (ram_addr_t)mr);
      if (l._4_4_ == WRITE_DATA) {
        memcpy((void *)addr1,local_60,(size_t)ram_ptr);
      }
      else if (l._4_4_ == FLUSH_CACHE) {
        flush_icache_range_tricore(addr1,(uintptr_t)(addr1 + (long)ram_ptr));
      }
    }
    else {
      iVar2 = memory_access_size(mr_00,(uint)ram_ptr,(hwaddr)mr);
      ram_ptr = (uint8_t *)(long)iVar2;
    }
    local_60 = ram_ptr + (long)local_60;
    ptr_local = ram_ptr + (long)ptr_local;
  }
  return 0;
}

Assistant:

static inline MemTxResult address_space_write_rom_internal(AddressSpace *as,
                                                           hwaddr addr,
                                                           MemTxAttrs attrs,
                                                           const void *ptr,
                                                           hwaddr len,
                                                           enum write_rom_type type)
{
    hwaddr l;
    uint8_t *ram_ptr;
    hwaddr addr1;
    MemoryRegion *mr;
    const uint8_t *buf = ptr;

    while (len > 0) {
        l = len;
        mr = address_space_translate(as, addr, &addr1, &l, true, attrs);

        if (!memory_region_is_ram(mr)) {
            l = memory_access_size(mr, l, addr1);
        } else {
            /* ROM/RAM case */
            ram_ptr = qemu_map_ram_ptr(as->uc, mr->ram_block, addr1);
            switch (type) {
            case WRITE_DATA:
                memcpy(ram_ptr, buf, l);
                break;
            case FLUSH_CACHE:
                flush_icache_range((uintptr_t)ram_ptr, (uintptr_t)ram_ptr + l);
                break;
            }
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return MEMTX_OK;
}